

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_layer2.c
# Opt level: O0

_Bool oonf_layer2_data_set
                (oonf_layer2_data *l2data,oonf_layer2_origin *origin,oonf_layer2_metadata *meta,
                oonf_layer2_value *input)

{
  int iVar1;
  _Bool local_3a;
  _Bool local_39;
  _Bool changed;
  oonf_layer2_value *input_local;
  oonf_layer2_metadata *meta_local;
  oonf_layer2_origin *origin_local;
  oonf_layer2_data *l2data_local;
  
  local_39 = false;
  input_local = (oonf_layer2_value *)meta;
  if (meta == (oonf_layer2_metadata *)0x0) {
    if (l2data->_meta == (oonf_layer2_metadata *)0x0) {
      if ((log_global_mask[_oonf_layer2_subsystem.logging] & 8) != 0) {
        oonf_log(LOG_SEVERITY_ASSERT,_oonf_layer2_subsystem.logging,"src/base/oonf_layer2.c",0x15b,
                 (void *)0x0,0,"Tried to set layer2 data without metadata (origin: %s)",origin->name
                );
        abort();
      }
    }
    input_local = (oonf_layer2_value *)l2data->_meta;
  }
  if ((((l2data->_meta == (oonf_layer2_metadata *)0x0) ||
       (l2data->_origin == (oonf_layer2_origin *)0x0)) || (l2data->_origin == origin)) ||
     (l2data->_origin->priority < origin->priority)) {
    local_3a = true;
    if ((oonf_layer2_value *)l2data->_meta == input_local) {
      iVar1 = memcmp(l2data,input,0x18);
      local_3a = iVar1 != 0;
    }
    local_39 = local_3a;
    (l2data->_value).integer = input->integer;
    *(undefined8 *)((long)&l2data->_value + 8) = *(undefined8 *)((input->addr)._addr + 8);
    *(undefined8 *)((long)&l2data->_value + 0x10) = *(undefined8 *)&(input->addr)._type;
    l2data->_meta = (oonf_layer2_metadata *)input_local;
    l2data->_origin = origin;
  }
  return local_39;
}

Assistant:

bool
oonf_layer2_data_set(struct oonf_layer2_data *l2data, const struct oonf_layer2_origin *origin,
  const struct oonf_layer2_metadata *meta, const union oonf_layer2_value *input) {
  bool changed = false;

  if (meta == NULL) {
    OONF_ASSERT(l2data->_meta != NULL, LOG_LAYER2, "Tried to set layer2 data without metadata (origin: %s)", origin->name);
    meta = l2data->_meta;
  }
  if (l2data->_meta == NULL || l2data->_origin == NULL || l2data->_origin == origin ||
      l2data->_origin->priority < origin->priority) {
    changed = l2data->_meta != meta || memcmp(&l2data->_value, input, sizeof(*input)) != 0;
    memcpy(&l2data->_value, input, sizeof(*input));
    l2data->_meta = meta;
    l2data->_origin = origin;
  }
  return changed;
}